

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O2

bool __thiscall spirv_cross::CompilerMSL::uses_explicit_early_fragment_test(CompilerMSL *this)

{
  bool bVar1;
  SPIREntryPoint *pSVar2;
  
  pSVar2 = Compiler::get_entry_point((Compiler *)this);
  if (((pSVar2->flags).lower & 0x200) == 0) {
    bVar1 = Bitset::get(&pSVar2->flags,0x115e);
    return bVar1;
  }
  return true;
}

Assistant:

bool CompilerMSL::uses_explicit_early_fragment_test()
{
	auto &ep_flags = get_entry_point().flags;
	return ep_flags.get(ExecutionModeEarlyFragmentTests) || ep_flags.get(ExecutionModePostDepthCoverage);
}